

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_debug_prefix_nal_unit_svc(nal_t *nal,bs_t *b)

{
  uint32_t uVar1;
  int iVar2;
  FILE *pFVar3;
  
  if (nal->nal_ref_idc == 0) {
    iVar2 = more_rbsp_data(b);
    if (iVar2 != 0) {
      while (iVar2 = more_rbsp_data(b), iVar2 != 0) {
        pFVar3 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar3 = _stdout;
        }
        fprintf(pFVar3,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar1 = bs_read_u1(b);
        nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag = SUB41(uVar1,0);
        pFVar3 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar3 = _stdout;
        }
        fprintf(pFVar3,"nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag: %d \n",
                (ulong)uVar1);
      }
    }
  }
  else {
    pFVar3 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar3 = _stdout;
    }
    fprintf(pFVar3,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    nal->prefix_nal_svc->store_ref_base_pic_flag = SUB41(uVar1,0);
    pFVar3 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar3 = _stdout;
    }
    fprintf(pFVar3,"nal->prefix_nal_svc->store_ref_base_pic_flag: %d \n",(ulong)uVar1);
    if (((nal->nal_svc_ext->use_ref_base_pic_flag != false) ||
        (nal->prefix_nal_svc->store_ref_base_pic_flag == true)) &&
       (nal->nal_svc_ext->idr_flag == false)) {
      read_debug_dec_ref_base_pic_marking(nal,b);
    }
    pFVar3 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar3 = _stdout;
    }
    fprintf(pFVar3,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag = SUB41(uVar1,0);
    pFVar3 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar3 = _stdout;
    }
    fprintf(pFVar3,"nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag: %d \n",
            (ulong)uVar1);
    if (nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag == true) {
      while (iVar2 = more_rbsp_data(b), iVar2 != 0) {
        pFVar3 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar3 = _stdout;
        }
        fprintf(pFVar3,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar1 = bs_read_u1(b);
        nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag = SUB41(uVar1,0);
        pFVar3 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar3 = _stdout;
        }
        fprintf(pFVar3,"nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag: %d \n",
                (ulong)uVar1);
      }
    }
  }
  return;
}

Assistant:

void read_debug_prefix_nal_unit_svc(nal_t* nal, bs_t* b)
{
    if( nal->nal_ref_idc != 0 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); nal->prefix_nal_svc->store_ref_base_pic_flag = bs_read_u1(b); printf("nal->prefix_nal_svc->store_ref_base_pic_flag: %d \n", nal->prefix_nal_svc->store_ref_base_pic_flag); 
        if( ( nal->nal_svc_ext->use_ref_base_pic_flag || nal->prefix_nal_svc->store_ref_base_pic_flag ) &&
             !nal->nal_svc_ext->idr_flag )
        {
            read_debug_dec_ref_base_pic_marking( nal, b );
        }
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag = bs_read_u1(b); printf("nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag: %d \n", nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag); 
        if( nal->prefix_nal_svc->additional_prefix_nal_unit_extension_flag )
        {
            while( more_rbsp_data( b ) )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag = bs_read_u1(b); printf("nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag: %d \n", nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag); 
            }
        }
    }
    else if( more_rbsp_data( b ) )
    {
        while( more_rbsp_data( b ) )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag = bs_read_u1(b); printf("nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag: %d \n", nal->prefix_nal_svc->additional_prefix_nal_unit_extension_data_flag); 
        }
    }
}